

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MruDictionary.h
# Opt level: O2

void __thiscall
JsUtil::
MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
::MruListEntry::MruListEntry(MruListEntry *this,RegexKey *key,RegexPattern **value)

{
  (this->
  super_DoublyLinkedListElement<JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruListEntry,_Memory::Recycler>
  ).previous.ptr = (MruListEntry *)0x0;
  (this->
  super_DoublyLinkedListElement<JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruListEntry,_Memory::Recycler>
  ).next.ptr = (MruListEntry *)0x0;
  Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>::WriteBarrierSet(&this->value,*value);
  UnifiedRegex::RegexKey::RegexKey(&this->key,key);
  this->dictionaryDataIndex = 0;
  return;
}

Assistant:

MruListEntry(const TKey &key, const TValue &value) : key(key), value(value), dictionaryDataIndex(0)
            {
            }